

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kwsParser.cxx
# Opt level: O3

bool __thiscall
kws::Parser::IsBetweenQuote(Parser *this,size_t pos,bool withComments,string *buffer)

{
  pointer pcVar1;
  bool bVar2;
  bool bVar3;
  string local_70;
  string local_50;
  
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  pcVar1 = (buffer->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_70,pcVar1,pcVar1 + buffer->_M_string_length);
  bVar2 = IsBetweenSingleQuote(this,pos,withComments,&local_70);
  bVar3 = true;
  if (!bVar2) {
    pcVar1 = (buffer->_M_dataplus)._M_p;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,pcVar1,pcVar1 + buffer->_M_string_length);
    bVar3 = IsBetweenDoubleQuote(this,pos,withComments,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  return bVar3;
}

Assistant:

bool Parser::IsBetweenQuote(size_t pos,bool withComments,std::string buffer) const
{
  return ( this->IsBetweenSingleQuote(pos,withComments,buffer) ||
    this->IsBetweenDoubleQuote(pos,withComments,buffer) );
}